

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O3

int __thiscall Amiga::Chipset::advance_slots<true>(Chipset *this,int first_slot,int last_slot)

{
  bool bVar1;
  int iVar2;
  
  if (first_slot == last_slot) {
LAB_00248e8e:
    iVar2 = -1;
  }
  else {
    if (last_slot <= first_slot) {
      __assert_fail("last_slot > first_slot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Chipset.cpp"
                    ,0x2a2,"int Amiga::Chipset::advance_slots(int, int) [stop_on_cpu = true]");
    }
    switch(first_slot) {
    case 0:
      output<0>(this);
      bVar1 = perform_cycle<0,true>(this);
      if (bVar1) {
        return 1;
      }
      if (last_slot == 1) goto LAB_00248e8e;
      break;
    case 1:
      break;
    case 2:
      goto switchD_00248ec1_caseD_2;
    case 3:
      goto switchD_00248ec1_caseD_3;
    case 4:
      goto switchD_00248ec1_caseD_4;
    case 5:
      goto switchD_00248ec1_caseD_5;
    case 6:
      goto switchD_00248ec1_caseD_6;
    case 7:
      goto switchD_00248ec1_caseD_7;
    case 8:
      goto switchD_00248ec1_caseD_8;
    case 9:
      goto switchD_00248ec1_caseD_9;
    case 10:
      goto switchD_00248ec1_caseD_a;
    case 0xb:
      goto switchD_00248ec1_caseD_b;
    case 0xc:
      goto switchD_00248ec1_caseD_c;
    case 0xd:
      goto switchD_00248ec1_caseD_d;
    case 0xe:
      goto switchD_00248ec1_caseD_e;
    case 0xf:
      goto switchD_00248ec1_caseD_f;
    case 0x10:
      goto switchD_00248ec1_caseD_10;
    case 0x11:
      goto switchD_00248ec1_caseD_11;
    case 0x12:
      goto switchD_00248ec1_caseD_12;
    case 0x13:
      goto switchD_00248ec1_caseD_13;
    case 0x14:
      goto switchD_00248ec1_caseD_14;
    case 0x15:
      goto switchD_00248ec1_caseD_15;
    case 0x16:
      goto switchD_00248ec1_caseD_16;
    case 0x17:
      goto switchD_00248ec1_caseD_17;
    case 0x18:
      goto switchD_00248ec1_caseD_18;
    case 0x19:
      goto switchD_00248ec1_caseD_19;
    case 0x1a:
      goto switchD_00248ec1_caseD_1a;
    case 0x1b:
      goto switchD_00248ec1_caseD_1b;
    case 0x1c:
      goto switchD_00248ec1_caseD_1c;
    case 0x1d:
      goto switchD_00248ec1_caseD_1d;
    case 0x1e:
      goto switchD_00248ec1_caseD_1e;
    case 0x1f:
      goto switchD_00248ec1_caseD_1f;
    case 0x20:
      goto switchD_00248ec1_caseD_20;
    case 0x21:
      goto switchD_00248ec1_caseD_21;
    case 0x22:
      goto switchD_00248ec1_caseD_22;
    case 0x23:
      goto switchD_00248ec1_caseD_23;
    case 0x24:
      goto switchD_00248ec1_caseD_24;
    case 0x25:
      goto switchD_00248ec1_caseD_25;
    case 0x26:
      goto switchD_00248ec1_caseD_26;
    case 0x27:
      goto switchD_00248ec1_caseD_27;
    case 0x28:
      goto switchD_00248ec1_caseD_28;
    case 0x29:
      goto switchD_00248ec1_caseD_29;
    case 0x2a:
      goto switchD_00248ec1_caseD_2a;
    case 0x2b:
      goto switchD_00248ec1_caseD_2b;
    case 0x2c:
      goto switchD_00248ec1_caseD_2c;
    case 0x2d:
      goto switchD_00248ec1_caseD_2d;
    case 0x2e:
      goto switchD_00248ec1_caseD_2e;
    case 0x2f:
      goto switchD_00248ec1_caseD_2f;
    case 0x30:
      goto switchD_00248ec1_caseD_30;
    case 0x31:
      goto switchD_00248ec1_caseD_31;
    case 0x32:
      goto switchD_00248ec1_caseD_32;
    case 0x33:
      goto switchD_00248ec1_caseD_33;
    case 0x34:
      goto switchD_00248ec1_caseD_34;
    case 0x35:
      goto switchD_00248ec1_caseD_35;
    case 0x36:
      goto switchD_00248ec1_caseD_36;
    case 0x37:
      goto switchD_00248ec1_caseD_37;
    case 0x38:
      goto switchD_00248ec1_caseD_38;
    case 0x39:
      goto switchD_00248ec1_caseD_39;
    case 0x3a:
      goto switchD_00248ec1_caseD_3a;
    case 0x3b:
      goto switchD_00248ec1_caseD_3b;
    case 0x3c:
      goto switchD_00248ec1_caseD_3c;
    case 0x3d:
      goto switchD_00248ec1_caseD_3d;
    case 0x3e:
      goto switchD_00248ec1_caseD_3e;
    case 0x3f:
      goto switchD_00248ec1_caseD_3f;
    case 0x40:
      goto switchD_00248ec1_caseD_40;
    case 0x41:
      goto switchD_00248ec1_caseD_41;
    case 0x42:
      goto switchD_00248ec1_caseD_42;
    case 0x43:
      goto switchD_00248ec1_caseD_43;
    case 0x44:
      goto switchD_00248ec1_caseD_44;
    case 0x45:
      goto switchD_00248ec1_caseD_45;
    case 0x46:
      goto switchD_00248ec1_caseD_46;
    case 0x47:
      goto switchD_00248ec1_caseD_47;
    case 0x48:
      goto switchD_00248ec1_caseD_48;
    case 0x49:
      goto switchD_00248ec1_caseD_49;
    case 0x4a:
      goto switchD_00248ec1_caseD_4a;
    case 0x4b:
      goto switchD_00248ec1_caseD_4b;
    case 0x4c:
      goto switchD_00248ec1_caseD_4c;
    case 0x4d:
      goto switchD_00248ec1_caseD_4d;
    case 0x4e:
      goto switchD_00248ec1_caseD_4e;
    case 0x4f:
      goto switchD_00248ec1_caseD_4f;
    case 0x50:
      goto switchD_00248ec1_caseD_50;
    case 0x51:
      goto switchD_00248ec1_caseD_51;
    case 0x52:
      goto switchD_00248ec1_caseD_52;
    case 0x53:
      goto switchD_00248ec1_caseD_53;
    case 0x54:
      goto switchD_00248ec1_caseD_54;
    case 0x55:
      goto switchD_00248ec1_caseD_55;
    case 0x56:
      goto switchD_00248ec1_caseD_56;
    case 0x57:
      goto switchD_00248ec1_caseD_57;
    case 0x58:
      goto switchD_00248ec1_caseD_58;
    case 0x59:
      goto switchD_00248ec1_caseD_59;
    case 0x5a:
      goto switchD_00248ec1_caseD_5a;
    case 0x5b:
      goto switchD_00248ec1_caseD_5b;
    case 0x5c:
      goto switchD_00248ec1_caseD_5c;
    case 0x5d:
      goto switchD_00248ec1_caseD_5d;
    case 0x5e:
      goto switchD_00248ec1_caseD_5e;
    case 0x5f:
      goto switchD_00248ec1_caseD_5f;
    case 0x60:
      goto switchD_00248ec1_caseD_60;
    case 0x61:
      goto switchD_00248ec1_caseD_61;
    case 0x62:
      goto switchD_00248ec1_caseD_62;
    case 99:
      goto switchD_00248ec1_caseD_63;
    case 100:
      goto switchD_00248ec1_caseD_64;
    case 0x65:
      goto switchD_00248ec1_caseD_65;
    case 0x66:
      goto switchD_00248ec1_caseD_66;
    case 0x67:
      goto switchD_00248ec1_caseD_67;
    case 0x68:
      goto switchD_00248ec1_caseD_68;
    case 0x69:
      goto switchD_00248ec1_caseD_69;
    case 0x6a:
      goto switchD_00248ec1_caseD_6a;
    case 0x6b:
      goto switchD_00248ec1_caseD_6b;
    case 0x6c:
      goto switchD_00248ec1_caseD_6c;
    case 0x6d:
      goto switchD_00248ec1_caseD_6d;
    case 0x6e:
      goto switchD_00248ec1_caseD_6e;
    case 0x6f:
      goto switchD_00248ec1_caseD_6f;
    case 0x70:
      goto switchD_00248ec1_caseD_70;
    case 0x71:
      goto switchD_00248ec1_caseD_71;
    case 0x72:
      goto switchD_00248ec1_caseD_72;
    case 0x73:
      goto switchD_00248ec1_caseD_73;
    case 0x74:
      goto switchD_00248ec1_caseD_74;
    case 0x75:
      goto switchD_00248ec1_caseD_75;
    case 0x76:
      goto switchD_00248ec1_caseD_76;
    case 0x77:
      goto switchD_00248ec1_caseD_77;
    case 0x78:
      goto switchD_00248ec1_caseD_78;
    case 0x79:
      goto switchD_00248ec1_caseD_79;
    case 0x7a:
      goto switchD_00248ec1_caseD_7a;
    case 0x7b:
      goto switchD_00248ec1_caseD_7b;
    case 0x7c:
      goto switchD_00248ec1_caseD_7c;
    case 0x7d:
      goto switchD_00248ec1_caseD_7d;
    case 0x7e:
      goto switchD_00248ec1_caseD_7e;
    case 0x7f:
      goto switchD_00248ec1_caseD_7f;
    case 0x80:
      goto switchD_00248ec1_caseD_80;
    case 0x81:
      goto switchD_00248ec1_caseD_81;
    case 0x82:
      goto switchD_00248ec1_caseD_82;
    case 0x83:
      goto switchD_00248ec1_caseD_83;
    case 0x84:
      goto switchD_00248ec1_caseD_84;
    case 0x85:
      goto switchD_00248ec1_caseD_85;
    case 0x86:
      goto switchD_00248ec1_caseD_86;
    case 0x87:
      goto switchD_00248ec1_caseD_87;
    case 0x88:
      goto switchD_00248ec1_caseD_88;
    case 0x89:
      goto switchD_00248ec1_caseD_89;
    case 0x8a:
      goto switchD_00248ec1_caseD_8a;
    case 0x8b:
      goto switchD_00248ec1_caseD_8b;
    case 0x8c:
      goto switchD_00248ec1_caseD_8c;
    case 0x8d:
      goto switchD_00248ec1_caseD_8d;
    case 0x8e:
      goto switchD_00248ec1_caseD_8e;
    case 0x8f:
      goto switchD_00248ec1_caseD_8f;
    case 0x90:
      goto switchD_00248ec1_caseD_90;
    case 0x91:
      goto switchD_00248ec1_caseD_91;
    case 0x92:
      goto switchD_00248ec1_caseD_92;
    case 0x93:
      goto switchD_00248ec1_caseD_93;
    case 0x94:
      goto switchD_00248ec1_caseD_94;
    case 0x95:
      goto switchD_00248ec1_caseD_95;
    case 0x96:
      goto switchD_00248ec1_caseD_96;
    case 0x97:
      goto switchD_00248ec1_caseD_97;
    case 0x98:
      goto switchD_00248ec1_caseD_98;
    case 0x99:
      goto switchD_00248ec1_caseD_99;
    case 0x9a:
      goto switchD_00248ec1_caseD_9a;
    case 0x9b:
      goto switchD_00248ec1_caseD_9b;
    case 0x9c:
      goto switchD_00248ec1_caseD_9c;
    case 0x9d:
      goto switchD_00248ec1_caseD_9d;
    case 0x9e:
      goto switchD_00248ec1_caseD_9e;
    case 0x9f:
      goto switchD_00248ec1_caseD_9f;
    case 0xa0:
      goto switchD_00248ec1_caseD_a0;
    case 0xa1:
      goto switchD_00248ec1_caseD_a1;
    case 0xa2:
      goto switchD_00248ec1_caseD_a2;
    case 0xa3:
      goto switchD_00248ec1_caseD_a3;
    case 0xa4:
      goto switchD_00248ec1_caseD_a4;
    case 0xa5:
      goto switchD_00248ec1_caseD_a5;
    case 0xa6:
      goto switchD_00248ec1_caseD_a6;
    case 0xa7:
      goto switchD_00248ec1_caseD_a7;
    case 0xa8:
      goto switchD_00248ec1_caseD_a8;
    case 0xa9:
      goto switchD_00248ec1_caseD_a9;
    case 0xaa:
      goto switchD_00248ec1_caseD_aa;
    case 0xab:
      goto switchD_00248ec1_caseD_ab;
    case 0xac:
      goto switchD_00248ec1_caseD_ac;
    case 0xad:
      goto switchD_00248ec1_caseD_ad;
    case 0xae:
      goto switchD_00248ec1_caseD_ae;
    case 0xaf:
      goto switchD_00248ec1_caseD_af;
    case 0xb0:
      goto switchD_00248ec1_caseD_b0;
    case 0xb1:
      goto switchD_00248ec1_caseD_b1;
    case 0xb2:
      goto switchD_00248ec1_caseD_b2;
    case 0xb3:
      goto switchD_00248ec1_caseD_b3;
    case 0xb4:
      goto switchD_00248ec1_caseD_b4;
    case 0xb5:
      goto switchD_00248ec1_caseD_b5;
    case 0xb6:
      goto switchD_00248ec1_caseD_b6;
    case 0xb7:
      goto switchD_00248ec1_caseD_b7;
    case 0xb8:
      goto switchD_00248ec1_caseD_b8;
    case 0xb9:
      goto switchD_00248ec1_caseD_b9;
    case 0xba:
      goto switchD_00248ec1_caseD_ba;
    case 0xbb:
      goto switchD_00248ec1_caseD_bb;
    case 0xbc:
      goto switchD_00248ec1_caseD_bc;
    case 0xbd:
      goto switchD_00248ec1_caseD_bd;
    case 0xbe:
      goto switchD_00248ec1_caseD_be;
    case 0xbf:
      goto switchD_00248ec1_caseD_bf;
    case 0xc0:
      goto switchD_00248ec1_caseD_c0;
    case 0xc1:
      goto switchD_00248ec1_caseD_c1;
    case 0xc2:
      goto switchD_00248ec1_caseD_c2;
    case 0xc3:
      goto switchD_00248ec1_caseD_c3;
    case 0xc4:
      goto switchD_00248ec1_caseD_c4;
    case 0xc5:
      goto switchD_00248ec1_caseD_c5;
    case 0xc6:
      goto switchD_00248ec1_caseD_c6;
    case 199:
      goto switchD_00248ec1_caseD_c7;
    case 200:
      goto switchD_00248ec1_caseD_c8;
    case 0xc9:
      goto switchD_00248ec1_caseD_c9;
    case 0xca:
      goto switchD_00248ec1_caseD_ca;
    case 0xcb:
      goto switchD_00248ec1_caseD_cb;
    case 0xcc:
      goto switchD_00248ec1_caseD_cc;
    case 0xcd:
      goto switchD_00248ec1_caseD_cd;
    case 0xce:
      goto switchD_00248ec1_caseD_ce;
    case 0xcf:
      goto switchD_00248ec1_caseD_cf;
    case 0xd0:
      goto switchD_00248ec1_caseD_d0;
    case 0xd1:
      goto switchD_00248ec1_caseD_d1;
    case 0xd2:
      goto switchD_00248ec1_caseD_d2;
    case 0xd3:
      goto switchD_00248ec1_caseD_d3;
    case 0xd4:
      goto switchD_00248ec1_caseD_d4;
    case 0xd5:
      goto switchD_00248ec1_caseD_d5;
    case 0xd6:
      goto switchD_00248ec1_caseD_d6;
    case 0xd7:
      goto switchD_00248ec1_caseD_d7;
    case 0xd8:
      goto switchD_00248ec1_caseD_d8;
    case 0xd9:
      goto switchD_00248ec1_caseD_d9;
    case 0xda:
      goto switchD_00248ec1_caseD_da;
    case 0xdb:
      goto switchD_00248ec1_caseD_db;
    case 0xdc:
      goto switchD_00248ec1_caseD_dc;
    case 0xdd:
      goto switchD_00248ec1_caseD_dd;
    case 0xde:
      goto switchD_00248ec1_caseD_de;
    case 0xdf:
      goto switchD_00248ec1_caseD_df;
    case 0xe0:
      goto switchD_00248ec1_caseD_e0;
    case 0xe1:
      goto switchD_00248ec1_caseD_e1;
    case 0xe2:
      goto switchD_00248ec1_caseD_e2;
    case 0xe3:
      goto switchD_00248ec1_caseD_e3;
    case 0xe4:
      goto switchD_00248ec1_caseD_e4;
    default:
      goto switchD_00248ec1_default;
    }
    output<1>(this);
    bVar1 = perform_cycle<1,true>(this);
    if (bVar1) {
      iVar2 = 2;
    }
    else {
      if (last_slot == 2) goto LAB_00248e8e;
switchD_00248ec1_caseD_2:
      output<2>(this);
      bVar1 = perform_cycle<2,true>(this);
      if (bVar1) {
        iVar2 = 3;
      }
      else {
        if (last_slot == 3) goto LAB_00248e8e;
switchD_00248ec1_caseD_3:
        output<3>(this);
        bVar1 = perform_cycle<3,true>(this);
        if (bVar1) {
          iVar2 = 4;
        }
        else {
          if (last_slot == 4) goto LAB_00248e8e;
switchD_00248ec1_caseD_4:
          output<4>(this);
          bVar1 = perform_cycle<4,true>(this);
          if (bVar1) {
            iVar2 = 5;
          }
          else {
            if (last_slot == 5) goto LAB_00248e8e;
switchD_00248ec1_caseD_5:
            output<5>(this);
            bVar1 = perform_cycle<5,true>(this);
            if (bVar1) {
              iVar2 = 6;
            }
            else {
              if (last_slot == 6) goto LAB_00248e8e;
switchD_00248ec1_caseD_6:
              output<6>(this);
              bVar1 = perform_cycle<6,true>(this);
              if (bVar1) {
                iVar2 = 7;
              }
              else {
                if (last_slot == 7) goto LAB_00248e8e;
switchD_00248ec1_caseD_7:
                output<7>(this);
                bVar1 = perform_cycle<7,true>(this);
                if (bVar1) {
                  iVar2 = 8;
                }
                else {
                  if (last_slot == 8) goto LAB_00248e8e;
switchD_00248ec1_caseD_8:
                  output<8>(this);
                  bVar1 = perform_cycle<8,true>(this);
                  if (bVar1) {
                    iVar2 = 9;
                  }
                  else {
                    if (last_slot == 9) goto LAB_00248e8e;
switchD_00248ec1_caseD_9:
                    output<9>(this);
                    bVar1 = perform_cycle<9,true>(this);
                    if (bVar1) {
                      iVar2 = 10;
                    }
                    else {
                      if (last_slot == 10) goto LAB_00248e8e;
switchD_00248ec1_caseD_a:
                      output<10>(this);
                      bVar1 = perform_cycle<10,true>(this);
                      if (bVar1) {
                        iVar2 = 0xb;
                      }
                      else {
                        if (last_slot == 0xb) goto LAB_00248e8e;
switchD_00248ec1_caseD_b:
                        output<11>(this);
                        bVar1 = perform_cycle<11,true>(this);
                        if (bVar1) {
                          iVar2 = 0xc;
                        }
                        else {
                          if (last_slot == 0xc) goto LAB_00248e8e;
switchD_00248ec1_caseD_c:
                          output<12>(this);
                          bVar1 = perform_cycle<12,true>(this);
                          if (bVar1) {
                            iVar2 = 0xd;
                          }
                          else {
                            if (last_slot == 0xd) goto LAB_00248e8e;
switchD_00248ec1_caseD_d:
                            output<13>(this);
                            bVar1 = perform_cycle<13,true>(this);
                            if (bVar1) {
                              iVar2 = 0xe;
                            }
                            else {
                              if (last_slot == 0xe) goto LAB_00248e8e;
switchD_00248ec1_caseD_e:
                              output<14>(this);
                              bVar1 = perform_cycle<14,true>(this);
                              if (bVar1) {
                                iVar2 = 0xf;
                              }
                              else {
                                if (last_slot == 0xf) goto LAB_00248e8e;
switchD_00248ec1_caseD_f:
                                output<15>(this);
                                bVar1 = perform_cycle<15,true>(this);
                                if (bVar1) {
                                  iVar2 = 0x10;
                                }
                                else {
                                  if (last_slot == 0x10) goto LAB_00248e8e;
switchD_00248ec1_caseD_10:
                                  output<16>(this);
                                  bVar1 = perform_cycle<16,true>(this);
                                  if (bVar1) {
                                    iVar2 = 0x11;
                                  }
                                  else {
                                    if (last_slot == 0x11) goto LAB_00248e8e;
switchD_00248ec1_caseD_11:
                                    output<17>(this);
                                    bVar1 = perform_cycle<17,true>(this);
                                    if (bVar1) {
                                      iVar2 = 0x12;
                                    }
                                    else {
                                      if (last_slot == 0x12) goto LAB_00248e8e;
switchD_00248ec1_caseD_12:
                                      output<18>(this);
                                      bVar1 = perform_cycle<18,true>(this);
                                      if (bVar1) {
                                        iVar2 = 0x13;
                                      }
                                      else {
                                        if (last_slot == 0x13) goto LAB_00248e8e;
switchD_00248ec1_caseD_13:
                                        output<19>(this);
                                        bVar1 = perform_cycle<19,true>(this);
                                        if (bVar1) {
                                          iVar2 = 0x14;
                                        }
                                        else {
                                          if (last_slot == 0x14) goto LAB_00248e8e;
switchD_00248ec1_caseD_14:
                                          output<20>(this);
                                          bVar1 = perform_cycle<20,true>(this);
                                          if (bVar1) {
                                            iVar2 = 0x15;
                                          }
                                          else {
                                            if (last_slot == 0x15) goto LAB_00248e8e;
switchD_00248ec1_caseD_15:
                                            output<21>(this);
                                            bVar1 = perform_cycle<21,true>(this);
                                            if (bVar1) {
                                              iVar2 = 0x16;
                                            }
                                            else {
                                              if (last_slot == 0x16) goto LAB_00248e8e;
switchD_00248ec1_caseD_16:
                                              output<22>(this);
                                              bVar1 = perform_cycle<22,true>(this);
                                              if (bVar1) {
                                                iVar2 = 0x17;
                                              }
                                              else {
                                                if (last_slot == 0x17) goto LAB_00248e8e;
switchD_00248ec1_caseD_17:
                                                output<23>(this);
                                                bVar1 = perform_cycle<23,true>(this);
                                                if (bVar1) {
                                                  iVar2 = 0x18;
                                                }
                                                else {
                                                  if (last_slot == 0x18) goto LAB_00248e8e;
switchD_00248ec1_caseD_18:
                                                  output<24>(this);
                                                  bVar1 = perform_cycle<24,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x19;
                                                  }
                                                  else {
                                                    if (last_slot == 0x19) goto LAB_00248e8e;
switchD_00248ec1_caseD_19:
                                                    output<25>(this);
                                                    bVar1 = perform_cycle<25,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x1a;
                                                    }
                                                    else {
                                                      if (last_slot == 0x1a) goto LAB_00248e8e;
switchD_00248ec1_caseD_1a:
                                                      output<26>(this);
                                                      bVar1 = perform_cycle<26,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x1b;
                                                      }
                                                      else {
                                                        if (last_slot == 0x1b) goto LAB_00248e8e;
switchD_00248ec1_caseD_1b:
                                                        output<27>(this);
                                                        bVar1 = perform_cycle<27,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x1c;
                                                        }
                                                        else {
                                                          if (last_slot == 0x1c) goto LAB_00248e8e;
switchD_00248ec1_caseD_1c:
                                                          output<28>(this);
                                                          bVar1 = perform_cycle<28,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x1d;
                                                          }
                                                          else {
                                                            if (last_slot == 0x1d)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_1d:
                                                            output<29>(this);
                                                            bVar1 = perform_cycle<29,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x1e;
                                                            }
                                                            else {
                                                              if (last_slot == 0x1e)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_1e:
                                                              output<30>(this);
                                                              bVar1 = perform_cycle<30,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x1f;
                                                              }
                                                              else {
                                                                if (last_slot == 0x1f)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_1f:
                                                                output<31>(this);
                                                                bVar1 = perform_cycle<31,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x20;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x20)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_20:
                                                                  output<32>(this);
                                                                  bVar1 = perform_cycle<32,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x21;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x21)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_21:
                                                                    output<33>(this);
                                                                    bVar1 = perform_cycle<33,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x22;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x22)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_22:
                                                                      output<34>(this);
                                                                      bVar1 = perform_cycle<34,true>
                                                                                        (this);
                                                                      if (bVar1) {
                                                                        iVar2 = 0x23;
                                                                      }
                                                                      else {
                                                                        if (last_slot == 0x23)
                                                                        goto LAB_00248e8e;
switchD_00248ec1_caseD_23:
                                                                        output<35>(this);
                                                                        bVar1 = 
                                                  perform_cycle<35,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x24;
                                                  }
                                                  else {
                                                    if (last_slot == 0x24) goto LAB_00248e8e;
switchD_00248ec1_caseD_24:
                                                    output<36>(this);
                                                    bVar1 = perform_cycle<36,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x25;
                                                    }
                                                    else {
                                                      if (last_slot == 0x25) goto LAB_00248e8e;
switchD_00248ec1_caseD_25:
                                                      output<37>(this);
                                                      bVar1 = perform_cycle<37,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x26;
                                                      }
                                                      else {
                                                        if (last_slot == 0x26) goto LAB_00248e8e;
switchD_00248ec1_caseD_26:
                                                        output<38>(this);
                                                        bVar1 = perform_cycle<38,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x27;
                                                        }
                                                        else {
                                                          if (last_slot == 0x27) goto LAB_00248e8e;
switchD_00248ec1_caseD_27:
                                                          output<39>(this);
                                                          bVar1 = perform_cycle<39,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x28;
                                                          }
                                                          else {
                                                            if (last_slot == 0x28)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_28:
                                                            output<40>(this);
                                                            bVar1 = perform_cycle<40,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x29;
                                                            }
                                                            else {
                                                              if (last_slot == 0x29)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_29:
                                                              output<41>(this);
                                                              bVar1 = perform_cycle<41,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x2a;
                                                              }
                                                              else {
                                                                if (last_slot == 0x2a)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_2a:
                                                                output<42>(this);
                                                                bVar1 = perform_cycle<42,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x2b;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x2b)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_2b:
                                                                  output<43>(this);
                                                                  bVar1 = perform_cycle<43,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x2c;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x2c)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_2c:
                                                                    output<44>(this);
                                                                    bVar1 = perform_cycle<44,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x2d;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x2d)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_2d:
                                                                      output<45>(this);
                                                                      bVar1 = perform_cycle<45,true>
                                                                                        (this);
                                                                      if (bVar1) {
                                                                        iVar2 = 0x2e;
                                                                      }
                                                                      else {
                                                                        if (last_slot == 0x2e)
                                                                        goto LAB_00248e8e;
switchD_00248ec1_caseD_2e:
                                                                        output<46>(this);
                                                                        bVar1 = 
                                                  perform_cycle<46,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x2f;
                                                  }
                                                  else {
                                                    if (last_slot == 0x2f) goto LAB_00248e8e;
switchD_00248ec1_caseD_2f:
                                                    output<47>(this);
                                                    bVar1 = perform_cycle<47,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x30;
                                                    }
                                                    else {
                                                      if (last_slot == 0x30) goto LAB_00248e8e;
switchD_00248ec1_caseD_30:
                                                      output<48>(this);
                                                      bVar1 = perform_cycle<48,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x31;
                                                      }
                                                      else {
                                                        if (last_slot == 0x31) goto LAB_00248e8e;
switchD_00248ec1_caseD_31:
                                                        output<49>(this);
                                                        bVar1 = perform_cycle<49,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x32;
                                                        }
                                                        else {
                                                          if (last_slot == 0x32) goto LAB_00248e8e;
switchD_00248ec1_caseD_32:
                                                          output<50>(this);
                                                          bVar1 = perform_cycle<50,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x33;
                                                          }
                                                          else {
                                                            if (last_slot == 0x33)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_33:
                                                            output<51>(this);
                                                            bVar1 = perform_cycle<51,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x34;
                                                            }
                                                            else {
                                                              if (last_slot == 0x34)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_34:
                                                              output<52>(this);
                                                              bVar1 = perform_cycle<52,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x35;
                                                              }
                                                              else {
                                                                if (last_slot == 0x35)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_35:
                                                                output<53>(this);
                                                                bVar1 = perform_cycle<53,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x36;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x36)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_36:
                                                                  output<54>(this);
                                                                  bVar1 = perform_cycle<54,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x37;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x37)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_37:
                                                                    output<55>(this);
                                                                    bVar1 = perform_cycle<55,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x38;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x38)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_38:
                                                                      output<56>(this);
                                                                      bVar1 = perform_cycle<56,true>
                                                                                        (this);
                                                                      if (bVar1) {
                                                                        iVar2 = 0x39;
                                                                      }
                                                                      else {
                                                                        if (last_slot == 0x39)
                                                                        goto LAB_00248e8e;
switchD_00248ec1_caseD_39:
                                                                        output<57>(this);
                                                                        bVar1 = 
                                                  perform_cycle<57,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x3a;
                                                  }
                                                  else {
                                                    if (last_slot == 0x3a) goto LAB_00248e8e;
switchD_00248ec1_caseD_3a:
                                                    output<58>(this);
                                                    bVar1 = perform_cycle<58,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x3b;
                                                    }
                                                    else {
                                                      if (last_slot == 0x3b) goto LAB_00248e8e;
switchD_00248ec1_caseD_3b:
                                                      output<59>(this);
                                                      bVar1 = perform_cycle<59,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x3c;
                                                      }
                                                      else {
                                                        if (last_slot == 0x3c) goto LAB_00248e8e;
switchD_00248ec1_caseD_3c:
                                                        output<60>(this);
                                                        bVar1 = perform_cycle<60,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x3d;
                                                        }
                                                        else {
                                                          if (last_slot == 0x3d) goto LAB_00248e8e;
switchD_00248ec1_caseD_3d:
                                                          output<61>(this);
                                                          bVar1 = perform_cycle<61,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x3e;
                                                          }
                                                          else {
                                                            if (last_slot == 0x3e)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_3e:
                                                            output<62>(this);
                                                            bVar1 = perform_cycle<62,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x3f;
                                                            }
                                                            else {
                                                              if (last_slot == 0x3f)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_3f:
                                                              output<63>(this);
                                                              bVar1 = perform_cycle<63,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x40;
                                                              }
                                                              else {
                                                                if (last_slot == 0x40)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_40:
                                                                output<64>(this);
                                                                bVar1 = perform_cycle<64,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x41;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x41)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_41:
                                                                  output<65>(this);
                                                                  bVar1 = perform_cycle<65,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x42;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x42)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_42:
                                                                    output<66>(this);
                                                                    bVar1 = perform_cycle<66,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x43;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x43)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_43:
                                                                      output<67>(this);
                                                                      bVar1 = perform_cycle<67,true>
                                                                                        (this);
                                                                      if (bVar1) {
                                                                        iVar2 = 0x44;
                                                                      }
                                                                      else {
                                                                        if (last_slot == 0x44)
                                                                        goto LAB_00248e8e;
switchD_00248ec1_caseD_44:
                                                                        output<68>(this);
                                                                        bVar1 = 
                                                  perform_cycle<68,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x45;
                                                  }
                                                  else {
                                                    if (last_slot == 0x45) goto LAB_00248e8e;
switchD_00248ec1_caseD_45:
                                                    output<69>(this);
                                                    bVar1 = perform_cycle<69,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x46;
                                                    }
                                                    else {
                                                      if (last_slot == 0x46) goto LAB_00248e8e;
switchD_00248ec1_caseD_46:
                                                      output<70>(this);
                                                      bVar1 = perform_cycle<70,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x47;
                                                      }
                                                      else {
                                                        if (last_slot == 0x47) goto LAB_00248e8e;
switchD_00248ec1_caseD_47:
                                                        output<71>(this);
                                                        bVar1 = perform_cycle<71,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x48;
                                                        }
                                                        else {
                                                          if (last_slot == 0x48) goto LAB_00248e8e;
switchD_00248ec1_caseD_48:
                                                          output<72>(this);
                                                          bVar1 = perform_cycle<72,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x49;
                                                          }
                                                          else {
                                                            if (last_slot == 0x49)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_49:
                                                            output<73>(this);
                                                            bVar1 = perform_cycle<73,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x4a;
                                                            }
                                                            else {
                                                              if (last_slot == 0x4a)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_4a:
                                                              output<74>(this);
                                                              bVar1 = perform_cycle<74,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x4b;
                                                              }
                                                              else {
                                                                if (last_slot == 0x4b)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_4b:
                                                                output<75>(this);
                                                                bVar1 = perform_cycle<75,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x4c;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x4c)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_4c:
                                                                  output<76>(this);
                                                                  bVar1 = perform_cycle<76,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x4d;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x4d)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_4d:
                                                                    output<77>(this);
                                                                    bVar1 = perform_cycle<77,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x4e;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x4e)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_4e:
                                                                      output<78>(this);
                                                                      bVar1 = perform_cycle<78,true>
                                                                                        (this);
                                                                      if (bVar1) {
                                                                        iVar2 = 0x4f;
                                                                      }
                                                                      else {
                                                                        if (last_slot == 0x4f)
                                                                        goto LAB_00248e8e;
switchD_00248ec1_caseD_4f:
                                                                        output<79>(this);
                                                                        bVar1 = 
                                                  perform_cycle<79,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x50;
                                                  }
                                                  else {
                                                    if (last_slot == 0x50) goto LAB_00248e8e;
switchD_00248ec1_caseD_50:
                                                    output<80>(this);
                                                    bVar1 = perform_cycle<80,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x51;
                                                    }
                                                    else {
                                                      if (last_slot == 0x51) goto LAB_00248e8e;
switchD_00248ec1_caseD_51:
                                                      output<81>(this);
                                                      bVar1 = perform_cycle<81,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x52;
                                                      }
                                                      else {
                                                        if (last_slot == 0x52) goto LAB_00248e8e;
switchD_00248ec1_caseD_52:
                                                        output<82>(this);
                                                        bVar1 = perform_cycle<82,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x53;
                                                        }
                                                        else {
                                                          if (last_slot == 0x53) goto LAB_00248e8e;
switchD_00248ec1_caseD_53:
                                                          output<83>(this);
                                                          bVar1 = perform_cycle<83,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x54;
                                                          }
                                                          else {
                                                            if (last_slot == 0x54)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_54:
                                                            output<84>(this);
                                                            bVar1 = perform_cycle<84,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x55;
                                                            }
                                                            else {
                                                              if (last_slot == 0x55)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_55:
                                                              output<85>(this);
                                                              bVar1 = perform_cycle<85,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x56;
                                                              }
                                                              else {
                                                                if (last_slot == 0x56)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_56:
                                                                output<86>(this);
                                                                bVar1 = perform_cycle<86,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x57;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x57)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_57:
                                                                  output<87>(this);
                                                                  bVar1 = perform_cycle<87,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x58;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x58)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_58:
                                                                    output<88>(this);
                                                                    bVar1 = perform_cycle<88,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x59;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x59)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_59:
                                                                      output<89>(this);
                                                                      bVar1 = perform_cycle<89,true>
                                                                                        (this);
                                                                      if (bVar1) {
                                                                        iVar2 = 0x5a;
                                                                      }
                                                                      else {
                                                                        if (last_slot == 0x5a)
                                                                        goto LAB_00248e8e;
switchD_00248ec1_caseD_5a:
                                                                        output<90>(this);
                                                                        bVar1 = 
                                                  perform_cycle<90,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x5b;
                                                  }
                                                  else {
                                                    if (last_slot == 0x5b) goto LAB_00248e8e;
switchD_00248ec1_caseD_5b:
                                                    output<91>(this);
                                                    bVar1 = perform_cycle<91,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x5c;
                                                    }
                                                    else {
                                                      if (last_slot == 0x5c) goto LAB_00248e8e;
switchD_00248ec1_caseD_5c:
                                                      output<92>(this);
                                                      bVar1 = perform_cycle<92,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x5d;
                                                      }
                                                      else {
                                                        if (last_slot == 0x5d) goto LAB_00248e8e;
switchD_00248ec1_caseD_5d:
                                                        output<93>(this);
                                                        bVar1 = perform_cycle<93,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x5e;
                                                        }
                                                        else {
                                                          if (last_slot == 0x5e) goto LAB_00248e8e;
switchD_00248ec1_caseD_5e:
                                                          output<94>(this);
                                                          bVar1 = perform_cycle<94,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x5f;
                                                          }
                                                          else {
                                                            if (last_slot == 0x5f)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_5f:
                                                            output<95>(this);
                                                            bVar1 = perform_cycle<95,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x60;
                                                            }
                                                            else {
                                                              if (last_slot == 0x60)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_60:
                                                              output<96>(this);
                                                              bVar1 = perform_cycle<96,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x61;
                                                              }
                                                              else {
                                                                if (last_slot == 0x61)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_61:
                                                                output<97>(this);
                                                                bVar1 = perform_cycle<97,true>(this)
                                                                ;
                                                                if (bVar1) {
                                                                  iVar2 = 0x62;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x62)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_62:
                                                                  output<98>(this);
                                                                  bVar1 = perform_cycle<98,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 99;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 99)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_63:
                                                                    output<99>(this);
                                                                    bVar1 = perform_cycle<99,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 100;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 100)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_64:
                                                                      output<100>(this);
                                                                      bVar1 = 
                                                  perform_cycle<100,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x65;
                                                  }
                                                  else {
                                                    if (last_slot == 0x65) goto LAB_00248e8e;
switchD_00248ec1_caseD_65:
                                                    output<101>(this);
                                                    bVar1 = perform_cycle<101,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x66;
                                                    }
                                                    else {
                                                      if (last_slot == 0x66) goto LAB_00248e8e;
switchD_00248ec1_caseD_66:
                                                      output<102>(this);
                                                      bVar1 = perform_cycle<102,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x67;
                                                      }
                                                      else {
                                                        if (last_slot == 0x67) goto LAB_00248e8e;
switchD_00248ec1_caseD_67:
                                                        output<103>(this);
                                                        bVar1 = perform_cycle<103,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x68;
                                                        }
                                                        else {
                                                          if (last_slot == 0x68) goto LAB_00248e8e;
switchD_00248ec1_caseD_68:
                                                          output<104>(this);
                                                          bVar1 = perform_cycle<104,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x69;
                                                          }
                                                          else {
                                                            if (last_slot == 0x69)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_69:
                                                            output<105>(this);
                                                            bVar1 = perform_cycle<105,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x6a;
                                                            }
                                                            else {
                                                              if (last_slot == 0x6a)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_6a:
                                                              output<106>(this);
                                                              bVar1 = perform_cycle<106,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x6b;
                                                              }
                                                              else {
                                                                if (last_slot == 0x6b)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_6b:
                                                                output<107>(this);
                                                                bVar1 = perform_cycle<107,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0x6c;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x6c)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_6c:
                                                                  output<108>(this);
                                                                  bVar1 = perform_cycle<108,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x6d;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x6d)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_6d:
                                                                    output<109>(this);
                                                                    bVar1 = perform_cycle<109,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x6e;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x6e)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_6e:
                                                                      output<110>(this);
                                                                      bVar1 = 
                                                  perform_cycle<110,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x6f;
                                                  }
                                                  else {
                                                    if (last_slot == 0x6f) goto LAB_00248e8e;
switchD_00248ec1_caseD_6f:
                                                    output<111>(this);
                                                    bVar1 = perform_cycle<111,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x70;
                                                    }
                                                    else {
                                                      if (last_slot == 0x70) goto LAB_00248e8e;
switchD_00248ec1_caseD_70:
                                                      output<112>(this);
                                                      bVar1 = perform_cycle<112,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x71;
                                                      }
                                                      else {
                                                        if (last_slot == 0x71) goto LAB_00248e8e;
switchD_00248ec1_caseD_71:
                                                        output<113>(this);
                                                        bVar1 = perform_cycle<113,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x72;
                                                        }
                                                        else {
                                                          if (last_slot == 0x72) goto LAB_00248e8e;
switchD_00248ec1_caseD_72:
                                                          output<114>(this);
                                                          bVar1 = perform_cycle<114,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x73;
                                                          }
                                                          else {
                                                            if (last_slot == 0x73)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_73:
                                                            output<115>(this);
                                                            bVar1 = perform_cycle<115,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x74;
                                                            }
                                                            else {
                                                              if (last_slot == 0x74)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_74:
                                                              output<116>(this);
                                                              bVar1 = perform_cycle<116,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x75;
                                                              }
                                                              else {
                                                                if (last_slot == 0x75)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_75:
                                                                output<117>(this);
                                                                bVar1 = perform_cycle<117,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0x76;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x76)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_76:
                                                                  output<118>(this);
                                                                  bVar1 = perform_cycle<118,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x77;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x77)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_77:
                                                                    output<119>(this);
                                                                    bVar1 = perform_cycle<119,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x78;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x78)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_78:
                                                                      output<120>(this);
                                                                      bVar1 = 
                                                  perform_cycle<120,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x79;
                                                  }
                                                  else {
                                                    if (last_slot == 0x79) goto LAB_00248e8e;
switchD_00248ec1_caseD_79:
                                                    output<121>(this);
                                                    bVar1 = perform_cycle<121,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x7a;
                                                    }
                                                    else {
                                                      if (last_slot == 0x7a) goto LAB_00248e8e;
switchD_00248ec1_caseD_7a:
                                                      output<122>(this);
                                                      bVar1 = perform_cycle<122,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x7b;
                                                      }
                                                      else {
                                                        if (last_slot == 0x7b) goto LAB_00248e8e;
switchD_00248ec1_caseD_7b:
                                                        output<123>(this);
                                                        bVar1 = perform_cycle<123,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x7c;
                                                        }
                                                        else {
                                                          if (last_slot == 0x7c) goto LAB_00248e8e;
switchD_00248ec1_caseD_7c:
                                                          output<124>(this);
                                                          bVar1 = perform_cycle<124,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x7d;
                                                          }
                                                          else {
                                                            if (last_slot == 0x7d)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_7d:
                                                            output<125>(this);
                                                            bVar1 = perform_cycle<125,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x7e;
                                                            }
                                                            else {
                                                              if (last_slot == 0x7e)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_7e:
                                                              output<126>(this);
                                                              bVar1 = perform_cycle<126,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x7f;
                                                              }
                                                              else {
                                                                if (last_slot == 0x7f)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_7f:
                                                                output<127>(this);
                                                                bVar1 = perform_cycle<127,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0x80;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x80)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_80:
                                                                  output<128>(this);
                                                                  bVar1 = perform_cycle<128,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x81;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x81)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_81:
                                                                    output<129>(this);
                                                                    bVar1 = perform_cycle<129,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x82;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x82)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_82:
                                                                      output<130>(this);
                                                                      bVar1 = 
                                                  perform_cycle<130,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x83;
                                                  }
                                                  else {
                                                    if (last_slot == 0x83) goto LAB_00248e8e;
switchD_00248ec1_caseD_83:
                                                    output<131>(this);
                                                    bVar1 = perform_cycle<131,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x84;
                                                    }
                                                    else {
                                                      if (last_slot == 0x84) goto LAB_00248e8e;
switchD_00248ec1_caseD_84:
                                                      output<132>(this);
                                                      bVar1 = perform_cycle<132,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x85;
                                                      }
                                                      else {
                                                        if (last_slot == 0x85) goto LAB_00248e8e;
switchD_00248ec1_caseD_85:
                                                        output<133>(this);
                                                        bVar1 = perform_cycle<133,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x86;
                                                        }
                                                        else {
                                                          if (last_slot == 0x86) goto LAB_00248e8e;
switchD_00248ec1_caseD_86:
                                                          output<134>(this);
                                                          bVar1 = perform_cycle<134,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x87;
                                                          }
                                                          else {
                                                            if (last_slot == 0x87)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_87:
                                                            output<135>(this);
                                                            bVar1 = perform_cycle<135,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x88;
                                                            }
                                                            else {
                                                              if (last_slot == 0x88)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_88:
                                                              output<136>(this);
                                                              bVar1 = perform_cycle<136,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x89;
                                                              }
                                                              else {
                                                                if (last_slot == 0x89)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_89:
                                                                output<137>(this);
                                                                bVar1 = perform_cycle<137,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0x8a;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x8a)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_8a:
                                                                  output<138>(this);
                                                                  bVar1 = perform_cycle<138,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x8b;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x8b)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_8b:
                                                                    output<139>(this);
                                                                    bVar1 = perform_cycle<139,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x8c;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x8c)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_8c:
                                                                      output<140>(this);
                                                                      bVar1 = 
                                                  perform_cycle<140,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x8d;
                                                  }
                                                  else {
                                                    if (last_slot == 0x8d) goto LAB_00248e8e;
switchD_00248ec1_caseD_8d:
                                                    output<141>(this);
                                                    bVar1 = perform_cycle<141,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x8e;
                                                    }
                                                    else {
                                                      if (last_slot == 0x8e) goto LAB_00248e8e;
switchD_00248ec1_caseD_8e:
                                                      output<142>(this);
                                                      bVar1 = perform_cycle<142,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x8f;
                                                      }
                                                      else {
                                                        if (last_slot == 0x8f) goto LAB_00248e8e;
switchD_00248ec1_caseD_8f:
                                                        output<143>(this);
                                                        bVar1 = perform_cycle<143,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x90;
                                                        }
                                                        else {
                                                          if (last_slot == 0x90) goto LAB_00248e8e;
switchD_00248ec1_caseD_90:
                                                          output<144>(this);
                                                          bVar1 = perform_cycle<144,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x91;
                                                          }
                                                          else {
                                                            if (last_slot == 0x91)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_91:
                                                            output<145>(this);
                                                            bVar1 = perform_cycle<145,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x92;
                                                            }
                                                            else {
                                                              if (last_slot == 0x92)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_92:
                                                              output<146>(this);
                                                              bVar1 = perform_cycle<146,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x93;
                                                              }
                                                              else {
                                                                if (last_slot == 0x93)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_93:
                                                                output<147>(this);
                                                                bVar1 = perform_cycle<147,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0x94;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x94)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_94:
                                                                  output<148>(this);
                                                                  bVar1 = perform_cycle<148,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x95;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x95)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_95:
                                                                    output<149>(this);
                                                                    bVar1 = perform_cycle<149,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0x96;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0x96)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_96:
                                                                      output<150>(this);
                                                                      bVar1 = 
                                                  perform_cycle<150,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0x97;
                                                  }
                                                  else {
                                                    if (last_slot == 0x97) goto LAB_00248e8e;
switchD_00248ec1_caseD_97:
                                                    output<151>(this);
                                                    bVar1 = perform_cycle<151,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0x98;
                                                    }
                                                    else {
                                                      if (last_slot == 0x98) goto LAB_00248e8e;
switchD_00248ec1_caseD_98:
                                                      output<152>(this);
                                                      bVar1 = perform_cycle<152,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0x99;
                                                      }
                                                      else {
                                                        if (last_slot == 0x99) goto LAB_00248e8e;
switchD_00248ec1_caseD_99:
                                                        output<153>(this);
                                                        bVar1 = perform_cycle<153,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0x9a;
                                                        }
                                                        else {
                                                          if (last_slot == 0x9a) goto LAB_00248e8e;
switchD_00248ec1_caseD_9a:
                                                          output<154>(this);
                                                          bVar1 = perform_cycle<154,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0x9b;
                                                          }
                                                          else {
                                                            if (last_slot == 0x9b)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_9b:
                                                            output<155>(this);
                                                            bVar1 = perform_cycle<155,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0x9c;
                                                            }
                                                            else {
                                                              if (last_slot == 0x9c)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_9c:
                                                              output<156>(this);
                                                              bVar1 = perform_cycle<156,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0x9d;
                                                              }
                                                              else {
                                                                if (last_slot == 0x9d)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_9d:
                                                                output<157>(this);
                                                                bVar1 = perform_cycle<157,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0x9e;
                                                                }
                                                                else {
                                                                  if (last_slot == 0x9e)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_9e:
                                                                  output<158>(this);
                                                                  bVar1 = perform_cycle<158,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0x9f;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0x9f)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_9f:
                                                                    output<159>(this);
                                                                    bVar1 = perform_cycle<159,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0xa0;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0xa0)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_a0:
                                                                      output<160>(this);
                                                                      bVar1 = 
                                                  perform_cycle<160,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xa1;
                                                  }
                                                  else {
                                                    if (last_slot == 0xa1) goto LAB_00248e8e;
switchD_00248ec1_caseD_a1:
                                                    output<161>(this);
                                                    bVar1 = perform_cycle<161,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xa2;
                                                    }
                                                    else {
                                                      if (last_slot == 0xa2) goto LAB_00248e8e;
switchD_00248ec1_caseD_a2:
                                                      output<162>(this);
                                                      bVar1 = perform_cycle<162,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xa3;
                                                      }
                                                      else {
                                                        if (last_slot == 0xa3) goto LAB_00248e8e;
switchD_00248ec1_caseD_a3:
                                                        output<163>(this);
                                                        bVar1 = perform_cycle<163,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xa4;
                                                        }
                                                        else {
                                                          if (last_slot == 0xa4) goto LAB_00248e8e;
switchD_00248ec1_caseD_a4:
                                                          output<164>(this);
                                                          bVar1 = perform_cycle<164,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xa5;
                                                          }
                                                          else {
                                                            if (last_slot == 0xa5)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_a5:
                                                            output<165>(this);
                                                            bVar1 = perform_cycle<165,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xa6;
                                                            }
                                                            else {
                                                              if (last_slot == 0xa6)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_a6:
                                                              output<166>(this);
                                                              bVar1 = perform_cycle<166,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xa7;
                                                              }
                                                              else {
                                                                if (last_slot == 0xa7)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_a7:
                                                                output<167>(this);
                                                                bVar1 = perform_cycle<167,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xa8;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xa8)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_a8:
                                                                  output<168>(this);
                                                                  bVar1 = perform_cycle<168,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0xa9;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0xa9)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_a9:
                                                                    output<169>(this);
                                                                    bVar1 = perform_cycle<169,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0xaa;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0xaa)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_aa:
                                                                      output<170>(this);
                                                                      bVar1 = 
                                                  perform_cycle<170,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xab;
                                                  }
                                                  else {
                                                    if (last_slot == 0xab) goto LAB_00248e8e;
switchD_00248ec1_caseD_ab:
                                                    output<171>(this);
                                                    bVar1 = perform_cycle<171,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xac;
                                                    }
                                                    else {
                                                      if (last_slot == 0xac) goto LAB_00248e8e;
switchD_00248ec1_caseD_ac:
                                                      output<172>(this);
                                                      bVar1 = perform_cycle<172,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xad;
                                                      }
                                                      else {
                                                        if (last_slot == 0xad) goto LAB_00248e8e;
switchD_00248ec1_caseD_ad:
                                                        output<173>(this);
                                                        bVar1 = perform_cycle<173,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xae;
                                                        }
                                                        else {
                                                          if (last_slot == 0xae) goto LAB_00248e8e;
switchD_00248ec1_caseD_ae:
                                                          output<174>(this);
                                                          bVar1 = perform_cycle<174,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xaf;
                                                          }
                                                          else {
                                                            if (last_slot == 0xaf)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_af:
                                                            output<175>(this);
                                                            bVar1 = perform_cycle<175,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xb0;
                                                            }
                                                            else {
                                                              if (last_slot == 0xb0)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_b0:
                                                              output<176>(this);
                                                              bVar1 = perform_cycle<176,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xb1;
                                                              }
                                                              else {
                                                                if (last_slot == 0xb1)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_b1:
                                                                output<177>(this);
                                                                bVar1 = perform_cycle<177,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xb2;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xb2)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_b2:
                                                                  output<178>(this);
                                                                  bVar1 = perform_cycle<178,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0xb3;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0xb3)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_b3:
                                                                    output<179>(this);
                                                                    bVar1 = perform_cycle<179,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0xb4;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0xb4)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_b4:
                                                                      output<180>(this);
                                                                      bVar1 = 
                                                  perform_cycle<180,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xb5;
                                                  }
                                                  else {
                                                    if (last_slot == 0xb5) goto LAB_00248e8e;
switchD_00248ec1_caseD_b5:
                                                    output<181>(this);
                                                    bVar1 = perform_cycle<181,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xb6;
                                                    }
                                                    else {
                                                      if (last_slot == 0xb6) goto LAB_00248e8e;
switchD_00248ec1_caseD_b6:
                                                      output<182>(this);
                                                      bVar1 = perform_cycle<182,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xb7;
                                                      }
                                                      else {
                                                        if (last_slot == 0xb7) goto LAB_00248e8e;
switchD_00248ec1_caseD_b7:
                                                        output<183>(this);
                                                        bVar1 = perform_cycle<183,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xb8;
                                                        }
                                                        else {
                                                          if (last_slot == 0xb8) goto LAB_00248e8e;
switchD_00248ec1_caseD_b8:
                                                          output<184>(this);
                                                          bVar1 = perform_cycle<184,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xb9;
                                                          }
                                                          else {
                                                            if (last_slot == 0xb9)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_b9:
                                                            output<185>(this);
                                                            bVar1 = perform_cycle<185,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xba;
                                                            }
                                                            else {
                                                              if (last_slot == 0xba)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_ba:
                                                              output<186>(this);
                                                              bVar1 = perform_cycle<186,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xbb;
                                                              }
                                                              else {
                                                                if (last_slot == 0xbb)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_bb:
                                                                output<187>(this);
                                                                bVar1 = perform_cycle<187,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xbc;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xbc)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_bc:
                                                                  output<188>(this);
                                                                  bVar1 = perform_cycle<188,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0xbd;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0xbd)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_bd:
                                                                    output<189>(this);
                                                                    bVar1 = perform_cycle<189,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0xbe;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0xbe)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_be:
                                                                      output<190>(this);
                                                                      bVar1 = 
                                                  perform_cycle<190,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xbf;
                                                  }
                                                  else {
                                                    if (last_slot == 0xbf) goto LAB_00248e8e;
switchD_00248ec1_caseD_bf:
                                                    output<191>(this);
                                                    bVar1 = perform_cycle<191,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xc0;
                                                    }
                                                    else {
                                                      if (last_slot == 0xc0) goto LAB_00248e8e;
switchD_00248ec1_caseD_c0:
                                                      output<192>(this);
                                                      bVar1 = perform_cycle<192,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xc1;
                                                      }
                                                      else {
                                                        if (last_slot == 0xc1) goto LAB_00248e8e;
switchD_00248ec1_caseD_c1:
                                                        output<193>(this);
                                                        bVar1 = perform_cycle<193,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xc2;
                                                        }
                                                        else {
                                                          if (last_slot == 0xc2) goto LAB_00248e8e;
switchD_00248ec1_caseD_c2:
                                                          output<194>(this);
                                                          bVar1 = perform_cycle<194,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xc3;
                                                          }
                                                          else {
                                                            if (last_slot == 0xc3)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_c3:
                                                            output<195>(this);
                                                            bVar1 = perform_cycle<195,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xc4;
                                                            }
                                                            else {
                                                              if (last_slot == 0xc4)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_c4:
                                                              output<196>(this);
                                                              bVar1 = perform_cycle<196,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xc5;
                                                              }
                                                              else {
                                                                if (last_slot == 0xc5)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_c5:
                                                                output<197>(this);
                                                                bVar1 = perform_cycle<197,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xc6;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xc6)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_c6:
                                                                  output<198>(this);
                                                                  bVar1 = perform_cycle<198,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 199;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 199)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_c7:
                                                                    output<199>(this);
                                                                    bVar1 = perform_cycle<199,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 200;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 200)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_c8:
                                                                      output<200>(this);
                                                                      bVar1 = 
                                                  perform_cycle<200,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xc9;
                                                  }
                                                  else {
                                                    if (last_slot == 0xc9) goto LAB_00248e8e;
switchD_00248ec1_caseD_c9:
                                                    output<201>(this);
                                                    bVar1 = perform_cycle<201,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xca;
                                                    }
                                                    else {
                                                      if (last_slot == 0xca) goto LAB_00248e8e;
switchD_00248ec1_caseD_ca:
                                                      output<202>(this);
                                                      bVar1 = perform_cycle<202,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xcb;
                                                      }
                                                      else {
                                                        if (last_slot == 0xcb) goto LAB_00248e8e;
switchD_00248ec1_caseD_cb:
                                                        output<203>(this);
                                                        bVar1 = perform_cycle<203,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xcc;
                                                        }
                                                        else {
                                                          if (last_slot == 0xcc) goto LAB_00248e8e;
switchD_00248ec1_caseD_cc:
                                                          output<204>(this);
                                                          bVar1 = perform_cycle<204,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xcd;
                                                          }
                                                          else {
                                                            if (last_slot == 0xcd)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_cd:
                                                            output<205>(this);
                                                            bVar1 = perform_cycle<205,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xce;
                                                            }
                                                            else {
                                                              if (last_slot == 0xce)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_ce:
                                                              output<206>(this);
                                                              bVar1 = perform_cycle<206,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xcf;
                                                              }
                                                              else {
                                                                if (last_slot == 0xcf)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_cf:
                                                                output<207>(this);
                                                                bVar1 = perform_cycle<207,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xd0;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xd0)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_d0:
                                                                  output<208>(this);
                                                                  bVar1 = perform_cycle<208,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0xd1;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0xd1)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_d1:
                                                                    output<209>(this);
                                                                    bVar1 = perform_cycle<209,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0xd2;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0xd2)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_d2:
                                                                      output<210>(this);
                                                                      bVar1 = 
                                                  perform_cycle<210,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xd3;
                                                  }
                                                  else {
                                                    if (last_slot == 0xd3) goto LAB_00248e8e;
switchD_00248ec1_caseD_d3:
                                                    output<211>(this);
                                                    bVar1 = perform_cycle<211,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xd4;
                                                    }
                                                    else {
                                                      if (last_slot == 0xd4) goto LAB_00248e8e;
switchD_00248ec1_caseD_d4:
                                                      output<212>(this);
                                                      bVar1 = perform_cycle<212,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xd5;
                                                      }
                                                      else {
                                                        if (last_slot == 0xd5) goto LAB_00248e8e;
switchD_00248ec1_caseD_d5:
                                                        output<213>(this);
                                                        bVar1 = perform_cycle<213,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xd6;
                                                        }
                                                        else {
                                                          if (last_slot == 0xd6) goto LAB_00248e8e;
switchD_00248ec1_caseD_d6:
                                                          output<214>(this);
                                                          bVar1 = perform_cycle<214,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xd7;
                                                          }
                                                          else {
                                                            if (last_slot == 0xd7)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_d7:
                                                            output<215>(this);
                                                            bVar1 = perform_cycle<215,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xd8;
                                                            }
                                                            else {
                                                              if (last_slot == 0xd8)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_d8:
                                                              output<216>(this);
                                                              bVar1 = perform_cycle<216,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xd9;
                                                              }
                                                              else {
                                                                if (last_slot == 0xd9)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_d9:
                                                                output<217>(this);
                                                                bVar1 = perform_cycle<217,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xda;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xda)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_da:
                                                                  output<218>(this);
                                                                  bVar1 = perform_cycle<218,true>
                                                                                    (this);
                                                                  if (bVar1) {
                                                                    iVar2 = 0xdb;
                                                                  }
                                                                  else {
                                                                    if (last_slot == 0xdb)
                                                                    goto LAB_00248e8e;
switchD_00248ec1_caseD_db:
                                                                    output<219>(this);
                                                                    bVar1 = perform_cycle<219,true>
                                                                                      (this);
                                                                    if (bVar1) {
                                                                      iVar2 = 0xdc;
                                                                    }
                                                                    else {
                                                                      if (last_slot == 0xdc)
                                                                      goto LAB_00248e8e;
switchD_00248ec1_caseD_dc:
                                                                      output<220>(this);
                                                                      bVar1 = 
                                                  perform_cycle<220,true>(this);
                                                  if (bVar1) {
                                                    iVar2 = 0xdd;
                                                  }
                                                  else {
                                                    if (last_slot == 0xdd) goto LAB_00248e8e;
switchD_00248ec1_caseD_dd:
                                                    output<221>(this);
                                                    bVar1 = perform_cycle<221,true>(this);
                                                    if (bVar1) {
                                                      iVar2 = 0xde;
                                                    }
                                                    else {
                                                      if (last_slot == 0xde) goto LAB_00248e8e;
switchD_00248ec1_caseD_de:
                                                      output<222>(this);
                                                      bVar1 = perform_cycle<222,true>(this);
                                                      if (bVar1) {
                                                        iVar2 = 0xdf;
                                                      }
                                                      else {
                                                        if (last_slot == 0xdf) goto LAB_00248e8e;
switchD_00248ec1_caseD_df:
                                                        output<223>(this);
                                                        bVar1 = perform_cycle<223,true>(this);
                                                        if (bVar1) {
                                                          iVar2 = 0xe0;
                                                        }
                                                        else {
                                                          if (last_slot == 0xe0) goto LAB_00248e8e;
switchD_00248ec1_caseD_e0:
                                                          output<224>(this);
                                                          bVar1 = perform_cycle<224,true>(this);
                                                          if (bVar1) {
                                                            iVar2 = 0xe1;
                                                          }
                                                          else {
                                                            if (last_slot == 0xe1)
                                                            goto LAB_00248e8e;
switchD_00248ec1_caseD_e1:
                                                            output<225>(this);
                                                            bVar1 = perform_cycle<225,true>(this);
                                                            if (bVar1) {
                                                              iVar2 = 0xe2;
                                                            }
                                                            else {
                                                              if (last_slot == 0xe2)
                                                              goto LAB_00248e8e;
switchD_00248ec1_caseD_e2:
                                                              output<226>(this);
                                                              bVar1 = perform_cycle<226,true>(this);
                                                              if (bVar1) {
                                                                iVar2 = 0xe3;
                                                              }
                                                              else {
                                                                if (last_slot == 0xe3)
                                                                goto LAB_00248e8e;
switchD_00248ec1_caseD_e3:
                                                                output<227>(this);
                                                                bVar1 = perform_cycle<227,true>
                                                                                  (this);
                                                                if (bVar1) {
                                                                  iVar2 = 0xe4;
                                                                }
                                                                else {
                                                                  if (last_slot == 0xe4)
                                                                  goto LAB_00248e8e;
switchD_00248ec1_caseD_e4:
                                                                  output<228>(this);
                                                                  bVar1 = perform_cycle<228,true>
                                                                                    (this);
                                                                  if (!bVar1) {
                                                                    if (last_slot == 0xe5) {
                                                                      return -1;
                                                                    }
switchD_00248ec1_default:
                                                                    __assert_fail("false",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Chipset.cpp"
                                                  ,0x2bd,
                                                  "int Amiga::Chipset::advance_slots(int, int) [stop_on_cpu = true]"
                                                  );
                                                  }
                                                  iVar2 = 0xe5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar2 = iVar2 - first_slot;
  }
  return iVar2;
}

Assistant:

int Chipset::advance_slots(int first_slot, int last_slot) {
	if(first_slot == last_slot) {
		return -1;
	}
	assert(last_slot > first_slot);

#define C(x)										\
	case x:											\
		output<x>();								\
													\
		if constexpr (stop_on_cpu) {				\
			if(perform_cycle<x, stop_on_cpu>()) {	\
				return 1 + x - first_slot;			\
			}										\
		} else {									\
			perform_cycle<x, stop_on_cpu>();		\
		}											\
													\
		if((x + 1) == last_slot) break;				\
		[[fallthrough]]

#define C10(x)	C(x); C(x+1); C(x+2); C(x+3); C(x+4); C(x+5); C(x+6); C(x+7); C(x+8); C(x+9);
	switch(first_slot) {
		C10(0);		C10(10);	C10(20);	C10(30);	C10(40);
		C10(50);	C10(60);	C10(70);	C10(80);	C10(90);
		C10(100);	C10(110);	C10(120);	C10(130);	C10(140);
		C10(150);	C10(160);	C10(170);	C10(180);	C10(190);
		C10(200);	C10(210);
		C(220);		C(221);		C(222);		C(223);		C(224);
		C(225);		C(226);		C(227);		C(228);

		default: assert(false);
	}
#undef C

	return -1;
}